

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this,Flags resultDisposition)

{
  ExpressionResultBuilder *pEVar1;
  long in_RDI;
  bool value;
  undefined4 in_stack_ffffffffffffff98;
  Flags in_stack_ffffffffffffff9c;
  ExpressionResultBuilder *in_stack_ffffffffffffffa0;
  bool in_stack_ffffffffffffffcf;
  string local_30 [35];
  byte local_d;
  
  local_d = *(byte *)(in_RDI + 0x228) & 1;
  toString_abi_cxx11_(in_stack_ffffffffffffffcf);
  pEVar1 = ExpressionResultBuilder::setLhs
                     (in_stack_ffffffffffffffa0,
                      (string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  ExpressionResultBuilder::setResultType(pEVar1,(bool)(local_d & 1));
  pEVar1 = ExpressionResultBuilder::endExpression
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  std::__cxx11::string::~string(local_30);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& endExpression( ResultDisposition::Flags resultDisposition ) {
        bool value = m_lhs ? true : false;
        return m_result
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression( resultDisposition );
    }